

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void kj::anon_unknown_36::requireValidHeaderValue(StringPtr value)

{
  ulong uVar1;
  _ *this;
  bool in_R8B;
  ArrayPtr<const_unsigned_char> bytes;
  DebugExpression<bool> local_31;
  Fault f;
  String local_28;
  
  this = (_ *)value.content.ptr;
  if (this + (value.content.size_ - 1) != this) {
    bytes.ptr = value.content.size_ - 1;
    uVar1 = 0;
    do {
      if (((byte)this[uVar1] < 0xe) && ((0x2401U >> ((byte)this[uVar1] & 0x1f) & 1) != 0)) {
        local_31.value = false;
        bytes.size_ = 0;
        kj::_::encodeCEscapeImpl(&local_28,this,bytes,in_R8B);
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[21],kj::String>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x1f6,FAILED,"HttpHeaders::isValidHeaderValue(value)",
                   "_kjCondition,\"invalid header value\", kj::encodeCEscape(value)",&local_31,
                   (char (*) [21])"invalid header value",&local_28);
        String::~String(&local_28);
        kj::_::Debug::Fault::fatal(&f);
      }
      uVar1 = uVar1 + 1;
    } while (bytes.ptr != uVar1);
  }
  return;
}

Assistant:

static void requireValidHeaderValue(kj::StringPtr value) {
  KJ_REQUIRE(HttpHeaders::isValidHeaderValue(value), "invalid header value",
      kj::encodeCEscape(value));
}